

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_seek(mcpl_file_t ff,uint64_t ipos)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong in_RSI;
  undefined8 *in_RDI;
  bool bVar5;
  int64_t targetpos;
  int error;
  int notEOF;
  int already_there;
  mcpl_fileinternal_t *f;
  ulong pos;
  
  uVar1 = in_RDI[0x11];
  pos = in_RSI;
  if ((ulong)in_RDI[8] <= in_RSI) {
    pos = in_RDI[8];
  }
  in_RDI[0x11] = pos;
  uVar2 = in_RDI[0x11];
  uVar3 = in_RDI[8];
  if ((uVar2 < uVar3 != 0) && (uVar1 != in_RSI)) {
    if (in_RDI[1] == 0) {
      iVar4 = fseek((FILE *)*in_RDI,in_RDI[0x10] + *(uint *)(in_RDI + 0xf) * in_RSI,0);
      bVar5 = iVar4 != 0;
    }
    else {
      iVar4 = mcpl_gzseek((gzFile)(in_RDI[0x11] * (ulong)*(uint *)(in_RDI + 0xf) + in_RDI[0x10]),pos
                         );
      bVar5 = iVar4 == 0;
    }
    if (bVar5) {
      mcpl_error((char *)0x10532d);
    }
  }
  return (uint)(uVar2 < uVar3);
}

Assistant:

int mcpl_seek(mcpl_file_t ff,uint64_t ipos)
{
  MCPLIMP_FILEDECODE;
  int already_there = (f->current_particle_idx==ipos);
  f->current_particle_idx = (ipos<f->nparticles?ipos:f->nparticles);
  int notEOF = f->current_particle_idx<f->nparticles;
  if (notEOF&&!already_there) {
    int error;
    if (f->filegz) {
      int64_t targetpos = f->current_particle_idx*f->particle_size+f->first_particle_pos;
      error = ! mcpl_gzseek( f->filegz, targetpos );
    } else {
      error = MCPL_FSEEK( f->file, f->first_particle_pos + f->particle_size * ipos )!=0;
    }
    if (error)
      mcpl_error("Errors encountered while seeking in particle list");
  }
  return notEOF;
}